

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

tokcxdef * tokcxini(errcxdef *errctx,mcmcxdef *mcmctx,tokldef *sctab)

{
  int iVar1;
  tokcxdef *__s;
  size_t sVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  ulong siz;
  tokscdef *ptVar6;
  uchar index [256];
  byte local_138 [264];
  
  iVar5 = 0;
  memset(local_138,0,0x100);
  bVar4 = sctab->toklstr[0];
  if (bVar4 == 0) {
    iVar1 = 0x520;
  }
  else {
    pcVar3 = sctab[1].toklstr;
    iVar5 = 0;
    iVar1 = 0x520;
    do {
      if (local_138[bVar4] == 0) {
        iVar5 = iVar5 + 1;
        local_138[bVar4] = (byte)iVar5;
      }
      bVar4 = *pcVar3;
      iVar1 = iVar1 + 0x18;
      pcVar3 = pcVar3 + 8;
    } while (bVar4 != 0);
  }
  siz = (ulong)(iVar1 + iVar5 * 8 & 0xfff8);
  __s = (tokcxdef *)mchalo(errctx,siz,"tokcxini");
  memset(__s,0,siz);
  memcpy(__s->tokcxinx,local_138,0x100);
  __s->tokcxerr = errctx;
  __s->tokcxmem = mcmctx;
  __s->tokcxifcur = 1;
  __s->tokcxptr = "";
  bVar4 = sctab->toklstr[0];
  if (bVar4 != 0) {
    ptVar6 = (tokscdef *)(__s[1].tokcxmsav + (long)iVar5 + -10);
    do {
      ptVar6->toksctyp = sctab->tokltyp;
      sVar2 = strlen(sctab->toklstr);
      ptVar6->toksclen = (int)sVar2;
      memcpy(ptVar6->tokscstr,sctab->toklstr,(long)(int)sVar2);
      bVar4 = local_138[bVar4];
      ptVar6->tokscnxt = __s->tokcxsc[bVar4];
      __s->tokcxsc[bVar4] = ptVar6;
      ptVar6 = ptVar6 + 1;
      bVar4 = sctab[1].toklstr[0];
      sctab = sctab + 1;
    } while (bVar4 != 0);
  }
  return __s;
}

Assistant:

tokcxdef *tokcxini(errcxdef *errctx, mcmcxdef *mcmctx, tokldef *sctab)
{
    int       i;
    int       cnt;
    tokldef  *p;
    uchar     c;
    uchar     index[256];
    tokcxdef *ret;
    tokscdef *sc;
    ushort    siz;
    
    /* set up index table: finds tokcxsc entry from character value */
    memset(index, 0, (size_t)sizeof(index));
    for (i = cnt = 0, p = sctab ; (c = p->toklstr[0]) != 0 ; ++cnt, ++p)
        if (!index[c]) index[c] = ++i;
    
    /* allocate memory for table plus the tokscdef's */
    siz = sizeof(tokcxdef) + (i * sizeof(tokscdef *))
          + ((cnt + 1) * sizeof(tokscdef));
    ret = (tokcxdef *)mchalo(errctx, siz, "tokcxini");
    memset(ret, 0, (size_t)siz);
    
    /* copy the index, set up fixed part */
    memcpy(ret->tokcxinx, index, sizeof(ret->tokcxinx));
    ret->tokcxerr = errctx;
    ret->tokcxmem = mcmctx;

    /* start out without an #if */
    ret->tokcxifcur = TOKIF_IF_YES;
    
    /* force the first toknext() to read a line */
    ret->tokcxptr = "\000";
    
    /* figure where the tokscdef's go (right after sc pointer array) */
    sc = (tokscdef *)&ret->tokcxsc[i+1];
    
    /* set up the individual tokscdef entries, and link into lists */
    for (p = sctab ; (c = p->toklstr[0]) != 0 ; ++p, ++sc)
    {
        size_t len;
        
        sc->toksctyp = p->tokltyp;
        len = sc->toksclen = strlen(p->toklstr);
        memcpy(sc->tokscstr, p->toklstr, len);
        sc->tokscnxt = ret->tokcxsc[index[c]];
        ret->tokcxsc[index[c]] = sc;
    }
    
    return(ret);
}